

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void destroyRootPage(Parse *pParse,int iTable,int iDb)

{
  undefined8 in_RAX;
  Vdbe *p;
  Parse *pPVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  uint p2;
  undefined4 uVar5;
  
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  p = sqlite3GetVdbe(pParse);
  if (pParse->nTempReg == '\0') {
    p2 = pParse->nMem + 1;
    pParse->nMem = p2;
  }
  else {
    bVar2 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar2;
    p2 = pParse->aTempReg[bVar2];
  }
  sqlite3VdbeAddOp3(p,0x66,iTable,p2,iDb);
  pPVar1 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar1 = pParse;
  }
  pPVar1->mayAbort = '\x01';
  pcVar3 = "sqlite_master";
  if (iDb == 1) {
    pcVar3 = "sqlite_temp_master";
  }
  sqlite3NestedParse(pParse,"UPDATE %Q.%s SET rootpage=%d WHERE #%d AND rootpage=#%d",
                     pParse->db->aDb[iDb].zName,pcVar3,(ulong)(uint)iTable,(ulong)p2,
                     CONCAT44(uVar5,p2));
  if (p2 != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      lVar4 = 0;
      do {
        if (*(uint *)((long)&pParse->aColCache[0].iReg + lVar4) == p2) {
          (&pParse->aColCache[0].tempReg)[lVar4] = '\x01';
          return;
        }
        lVar4 = lVar4 + 0x18;
      } while ((int)lVar4 != 0xf0);
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = p2;
    }
  }
  return;
}

Assistant:

static void destroyRootPage(Parse *pParse, int iTable, int iDb){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int r1 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_Destroy, iTable, r1, iDb);
  sqlite3MayAbort(pParse);
#ifndef SQLITE_OMIT_AUTOVACUUM
  /* OP_Destroy stores an in integer r1. If this integer
  ** is non-zero, then it is the root page number of a table moved to
  ** location iTable. The following code modifies the sqlite_master table to
  ** reflect this.
  **
  ** The "#NNN" in the SQL is a special constant that means whatever value
  ** is in register NNN.  See grammar rules associated with the TK_REGISTER
  ** token for additional information.
  */
  sqlite3NestedParse(pParse, 
     "UPDATE %Q.%s SET rootpage=%d WHERE #%d AND rootpage=#%d",
     pParse->db->aDb[iDb].zName, SCHEMA_TABLE(iDb), iTable, r1, r1);
#endif
  sqlite3ReleaseTempReg(pParse, r1);
}